

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::TapScriptSignData::ConvertFromStruct
          (TapScriptSignData *this,TapScriptSignDataStruct *data)

{
  TapScriptSignDataStruct *data_local;
  TapScriptSignData *this_local;
  
  std::__cxx11::string::operator=((string *)&this->hex_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->type_,(string *)&data->type);
  std::__cxx11::string::operator=((string *)&this->sighash_type_,(string *)&data->sighash_type);
  this->sighash_anyone_can_pay_ = (bool)(data->sighash_anyone_can_pay & 1);
  this->sighash_rangeproof_ = (bool)(data->sighash_rangeproof & 1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void TapScriptSignData::ConvertFromStruct(
    const TapScriptSignDataStruct& data) {
  hex_ = data.hex;
  type_ = data.type;
  sighash_type_ = data.sighash_type;
  sighash_anyone_can_pay_ = data.sighash_anyone_can_pay;
  sighash_rangeproof_ = data.sighash_rangeproof;
  ignore_items = data.ignore_items;
}